

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void __thiscall MD5::update(MD5 *this,uchar *input,size_type length)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = this->count[0];
  uVar1 = uVar3 >> 3 & 0x3f;
  this->count[0] = length * 8 + uVar3;
  this->count[1] = this->count[1] + (length >> 0x1d) + (uint)CARRY4(length * 8,uVar3);
  uVar3 = 0x40 - uVar1;
  if (length < uVar3) {
    uVar2 = (ulong)uVar1;
    uVar3 = 0;
  }
  else {
    memcpy(this->buffer + uVar1,input,(ulong)uVar3);
    transform(this,this->buffer);
    uVar2 = 0;
    while (uVar3 + 0x40 <= length) {
      transform(this,input + uVar3);
      uVar3 = uVar3 + 0x40;
    }
  }
  memcpy(this->buffer + uVar2,input + uVar3,(ulong)(length - uVar3));
  return;
}

Assistant:

void MD5::update(const unsigned char input[], size_type length)
{
  // compute number of bytes mod 64
  size_type index = count[0] / 8 % blocksize;
 
  // Update number of bits
  if ((count[0] += (length << 3)) < (length << 3))
    count[1]++;
  count[1] += (length >> 29);
 
  // number of bytes we need to fill in buffer
  size_type firstpart = 64 - index;
 
  size_type i;
 
  // transform as many times as possible.
  if (length >= firstpart)
  {
    // fill buffer first, transform
    memcpy(&buffer[index], input, firstpart);
    transform(buffer);
 
    // transform chunks of blocksize (64 bytes)
    for (i = firstpart; i + blocksize <= length; i += blocksize)
      transform(&input[i]);
 
    index = 0;
  }
  else
    i = 0;
 
  // buffer remaining input
  memcpy(&buffer[index], &input[i], length-i);
}